

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ushort uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 local_68 [16];
  size_t local_58;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_58 = 0;
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  local_68 = (undefined1  [16])0x0;
  puVar8 = (uint *)malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar8;
  uVar10 = (ulong)(tree->maxbitlen + 1);
  uVar7 = uivector_resize((uivector *)local_48,uVar10);
  if (uVar7 != 0) {
    if (uVar10 != 0) {
      memset((void *)local_48._0_8_,0,uVar10 << 2);
    }
    uVar10 = (ulong)(tree->maxbitlen + 1);
    uVar7 = uivector_resize((uivector *)local_68,uVar10);
    if (uVar7 != 0) {
      if (uVar10 != 0) {
        memset((void *)local_68._0_8_,0,uVar10 << 2);
      }
      if (puVar8 != (uint *)0x0) {
        if (tree->numcodes == 0) {
          uVar7 = 0;
        }
        else {
          puVar8 = tree->lengths;
          uVar7 = 0;
          do {
            uVar10 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            *(uint *)(local_48._0_8_ + (ulong)puVar8[uVar10] * 4) =
                 *(uint *)(local_48._0_8_ + (ulong)puVar8[uVar10] * 4) + 1;
          } while (uVar7 != tree->numcodes);
        }
        uVar4 = local_68._0_8_;
        if (tree->maxbitlen != 0) {
          uVar7 = *(uint *)local_68._0_8_;
          uVar10 = 1;
          do {
            uVar9 = (int)uVar10 + 1;
            uVar7 = (uVar7 + *(uint *)(local_48._0_8_ + (ulong)((int)uVar10 - 1) * 4)) * 2;
            *(uint *)(local_68._0_8_ + uVar10 * 4) = uVar7;
            uVar10 = (ulong)uVar9;
          } while (uVar9 <= tree->maxbitlen);
          uVar7 = tree->numcodes;
        }
        if (uVar7 != 0) {
          puVar8 = tree->lengths;
          uVar9 = 0;
          do {
            uVar10 = (ulong)puVar8[uVar9];
            if (uVar10 != 0) {
              uVar7 = *(uint *)(local_68._0_8_ + uVar10 * 4);
              *(uint *)(local_68._0_8_ + uVar10 * 4) = uVar7 + 1;
              tree->tree1d[uVar9] = uVar7;
              uVar7 = tree->numcodes;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar7);
        }
        free((void *)local_48._0_8_);
        free((void *)uVar4);
        uVar7 = tree->numcodes;
        uVar10 = (ulong)(uVar7 * 2);
        puVar8 = (uint *)malloc(uVar10 * 4);
        tree->tree2d = puVar8;
        if (puVar8 == (uint *)0x0) {
          return 0x53;
        }
        if (uVar10 != 0) {
          auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar18 = vpbroadcastd_avx512f(ZEXT416(0x7fff));
          auVar19 = vpbroadcastq_avx512f();
          uVar11 = 0;
          do {
            auVar20 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar20,auVar16);
            auVar20 = vporq_avx512f(auVar20,auVar17);
            vpcmpuq_avx512f(auVar20,auVar19,2);
            vpcmpuq_avx512f(auVar21,auVar19,2);
            auVar20 = vmovdqu32_avx512f(auVar18);
            *(undefined1 (*) [64])(puVar8 + uVar11) = auVar20;
            uVar11 = uVar11 + 0x10;
          } while ((uVar10 + 0xf & 0xfffffffffffffff0) != uVar11);
        }
        if ((ulong)uVar7 != 0) {
          puVar2 = tree->lengths;
          uVar11 = 0;
          iVar13 = 0;
          iVar12 = 0;
          do {
            uVar9 = puVar2[uVar11];
            if (uVar9 != 0) {
              puVar3 = tree->tree1d;
              uVar14 = 0;
              do {
                if (iVar13 < 0) {
                  return 0x37;
                }
                if (uVar7 < iVar13 + 2U) {
                  return 0x37;
                }
                uVar1 = (puVar3[uVar11] >> (~uVar14 + uVar9 & 0x1f) & 1) + iVar13 * 2;
                if (puVar8[uVar1] == 0x7fff) {
                  uVar14 = uVar14 + 1;
                  if (uVar14 == uVar9) {
                    puVar8[uVar1] = (uint)uVar11;
                    iVar13 = 0;
                    uVar14 = uVar9;
                  }
                  else {
                    iVar13 = iVar12 + 1;
                    puVar8[uVar1] = iVar12 + 1 + uVar7;
                    iVar12 = iVar13;
                  }
                }
                else {
                  uVar14 = uVar14 + 1;
                  iVar13 = puVar8[uVar1] - uVar7;
                }
                uVar9 = puVar2[uVar11];
              } while (uVar14 != uVar9);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar7);
          if (uVar7 * 2 != 0) {
            auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar18 = vpbroadcastd_avx512f(ZEXT416(0x7fff));
            uVar11 = 0;
            auVar19 = vpbroadcastq_avx512f();
            do {
              auVar20 = vpbroadcastq_avx512f();
              auVar21 = vporq_avx512f(auVar20,auVar16);
              auVar20 = vporq_avx512f(auVar20,auVar17);
              uVar4 = vpcmpuq_avx512f(auVar20,auVar19,2);
              uVar5 = vpcmpuq_avx512f(auVar21,auVar19,2);
              bVar6 = (byte)uVar5;
              uVar15 = CONCAT11(bVar6,(byte)uVar4);
              auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar8 + uVar11));
              auVar21._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar20._4_4_;
              auVar21._0_4_ = (uint)((byte)uVar4 & 1) * auVar20._0_4_;
              auVar21._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar20._8_4_;
              auVar21._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar20._12_4_;
              auVar21._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar20._16_4_;
              auVar21._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar20._20_4_;
              auVar21._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar20._24_4_;
              auVar21._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar20._28_4_;
              auVar21._32_4_ = (uint)(bVar6 & 1) * auVar20._32_4_;
              auVar21._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar20._36_4_;
              auVar21._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar20._40_4_;
              auVar21._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar20._44_4_;
              auVar21._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar20._48_4_;
              auVar21._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar20._52_4_;
              auVar21._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar20._56_4_;
              auVar21._60_4_ = (uint)(bVar6 >> 7) * auVar20._60_4_;
              vpcmpeqd_avx512f(auVar21,auVar18);
              auVar20 = vmovdqu32_avx512f(ZEXT1664((undefined1  [16])0x0));
              *(undefined1 (*) [64])(puVar8 + uVar11) = auVar20;
              uVar11 = uVar11 + 0x10;
            } while ((uVar10 + 0xf & 0xfffffffffffffff0) != uVar11);
            return 0;
          }
        }
        return 0;
      }
    }
  }
  free((void *)local_48._0_8_);
  free((void *)local_68._0_8_);
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned error = 0;
  unsigned bits, n;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}